

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O3

int do_gotoeop(int f,int n,int *i)

{
  int iVar1;
  bool bVar2;
  mgwin *pmVar3;
  bool bVar4;
  line *plVar5;
  ushort **ppuVar6;
  line *plVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  line *plVar11;
  line *plVar12;
  
  pmVar3 = curwp;
  if (n < 0) {
    iVar8 = gotobop(f,-n);
    return iVar8;
  }
  if (n == 0) {
    plVar7 = curwp->w_dotp->l_fp;
    plVar12 = curbp->b_headp;
  }
  else {
    plVar12 = curbp->b_headp;
    plVar11 = curwp->w_dotp;
    plVar7 = plVar11->l_fp;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + 1;
      *i = iVar8;
      if (plVar7 != plVar12) {
        iVar10 = pmVar3->w_dotline;
        bVar2 = false;
        do {
          plVar5 = plVar7;
          pmVar3->w_doto = 0;
          iVar1 = plVar11->l_used;
          if (0 < (long)iVar1) {
            ppuVar6 = __ctype_b_loc();
            lVar9 = 0;
            do {
              if ((*(byte *)((long)*ppuVar6 + (ulong)(byte)plVar11->l_text[lVar9] * 2 + 1) & 0x20)
                  == 0) {
                bVar4 = true;
                goto LAB_00114ac8;
              }
              lVar9 = lVar9 + 1;
            } while (iVar1 != lVar9);
          }
          plVar7 = plVar5;
          bVar4 = false;
          if (bVar2) break;
LAB_00114ac8:
          bVar2 = bVar4;
          pmVar3->w_dotp = plVar5;
          iVar10 = iVar10 + 1;
          pmVar3->w_dotline = iVar10;
          plVar7 = plVar5->l_fp;
          plVar11 = plVar5;
        } while (plVar7 != plVar12);
      }
    } while (iVar8 != n);
  }
  if (plVar7 == plVar12) {
    gotoeol(8,1);
    curwp->w_rflag = curwp->w_rflag | 2;
  }
  else {
    pmVar3->w_rflag = pmVar3->w_rflag | 2;
  }
  return (uint)(plVar7 != plVar12);
}

Assistant:

int
do_gotoeop(int f, int n, int *i)
{
	int col, nospace, j = 0;

	/* the other way... */
	if (n < 0)
		return (gotobop(f, -n));

	/* for each one asked for */
	while (n-- > 0) {
		*i = ++j;
		nospace = 0;
		while (lforw(curwp->w_dotp) != curbp->b_headp) {
			col = 0;
			curwp->w_doto = 0;

			while (col < llength(curwp->w_dotp) &&
			    (isspace(lgetc(curwp->w_dotp, col))))
				col++;

			if (col >= llength(curwp->w_dotp)) {
				if (nospace)
					break;
			} else
				nospace = 1;

			curwp->w_dotp = lforw(curwp->w_dotp);
			curwp->w_dotline++;

		}
	}
	/* do not continue after end of buffer */
	if (lforw(curwp->w_dotp) == curbp->b_headp) {
		gotoeol(FFRAND, 1);
		curwp->w_rflag |= WFMOVE;
		return (FALSE);
	}

	/* force screen update */
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}